

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

int __thiscall FIX::ScreenLogFactory::init(ScreenLogFactory *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_R8;
  allocator<char> local_49;
  string local_48;
  
  if (this->m_useSettings == true) {
    *in_RDX = 1;
    *in_RCX = 1;
    *in_R8 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ScreenLogShowIncoming",&local_49);
    bVar1 = Dictionary::has((Dictionary *)ctx,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"ScreenLogShowIncoming",&local_49);
      bVar1 = Dictionary::getBool((Dictionary *)ctx,&local_48);
      *in_RDX = bVar1;
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ScreenLogShowOutgoing",&local_49);
    bVar1 = Dictionary::has((Dictionary *)ctx,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"ScreenLogShowOutgoing",&local_49);
      bVar1 = Dictionary::getBool((Dictionary *)ctx,&local_48);
      *in_RCX = bVar1;
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ScreenLogShowEvents",&local_49);
    bVar1 = Dictionary::has((Dictionary *)ctx,&local_48);
    iVar2 = std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"ScreenLogShowEvents",&local_49);
      bVar1 = Dictionary::getBool((Dictionary *)ctx,&local_48);
      *in_R8 = bVar1;
      iVar2 = std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    *in_RDX = this->m_incoming;
    *in_RCX = this->m_outgoing;
    iVar2 = CONCAT31((int3)((uint)in_EAX >> 8),this->m_event);
    *in_R8 = this->m_event;
  }
  return iVar2;
}

Assistant:

void ScreenLogFactory::init(const Dictionary &settings, bool &incoming, bool &outgoing, bool &event) const {
  if (m_useSettings) {
    incoming = true;
    outgoing = true;
    event = true;

    if (settings.has(SCREEN_LOG_SHOW_INCOMING)) {
      incoming = settings.getBool(SCREEN_LOG_SHOW_INCOMING);
    }
    if (settings.has(SCREEN_LOG_SHOW_OUTGOING)) {
      outgoing = settings.getBool(SCREEN_LOG_SHOW_OUTGOING);
    }
    if (settings.has(SCREEN_LOG_SHOW_EVENTS)) {
      event = settings.getBool(SCREEN_LOG_SHOW_EVENTS);
    }
  } else {
    incoming = m_incoming;
    outgoing = m_outgoing;
    event = m_event;
  }
}